

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::BufferTestUtil::VertexArrayVerifier::VertexArrayVerifier
          (VertexArrayVerifier *this,RenderContext *renderCtx,TestLog *log)

{
  ShaderProgram **ppSVar1;
  RenderContext *renderCtx_00;
  GLSLVersion version;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  ShaderProgram *pSVar5;
  char *pcVar6;
  undefined4 extraout_var;
  TestError *this_00;
  allocator<char> local_172;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  ProgramSources local_f0;
  long lVar7;
  
  BufferVerifierBase::BufferVerifierBase(&this->super_BufferVerifierBase,renderCtx,log);
  (this->super_BufferVerifierBase)._vptr_BufferVerifierBase =
       (_func_int **)&PTR__VertexArrayVerifier_01e77788;
  this->m_program = (ShaderProgram *)0x0;
  this->m_posLoc = 0;
  this->m_byteVecLoc = 0;
  this->m_vao = 0;
  uVar2 = (*renderCtx->_vptr_RenderContext[2])(renderCtx);
  version = GLSL_VERSION_330;
  if ((uVar2 & 0x300) == 0) {
    version = GLSL_VERSION_300_ES;
  }
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  renderCtx_00 = (this->super_BufferVerifierBase).m_renderCtx;
  pcVar6 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar6,&local_171);
  std::operator+(&local_110,&local_130,
                 "\nin highp vec2 a_position;\nin mediump vec3 a_byteVec;\nout mediump vec3 v_byteVec;\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_byteVec = a_byteVec;\n}\n"
                );
  pcVar6 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,pcVar6,&local_172);
  std::operator+(&local_150,&local_170,
                 "\nin mediump vec3 v_byteVec;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(v_byteVec, 1.0);\n}\n"
                );
  glu::makeVtxFragSources(&local_f0,&local_110,&local_150);
  glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx_00,&local_f0);
  ppSVar1 = &this->m_program;
  *ppSVar1 = pSVar5;
  glu::ProgramSources::~ProgramSources(&local_f0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  if (((*ppSVar1)->m_program).m_info.linkOk != false) {
    iVar3 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar3);
    dVar4 = (**(code **)(lVar7 + 0x780))(((*ppSVar1)->m_program).m_program,"a_position");
    this->m_posLoc = dVar4;
    dVar4 = (**(code **)(lVar7 + 0x780))((this->m_program->m_program).m_program,"a_byteVec");
    this->m_byteVecLoc = dVar4;
    (**(code **)(lVar7 + 0x708))(1,&this->m_vao);
    (**(code **)(lVar7 + 0x6c8))(1,&this->m_positionBuf);
    (**(code **)(lVar7 + 0x6c8))(1,&this->m_indexBuf);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"Initialization failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                    ,0x1ce);
    return;
  }
  glu::operator<<((this->super_BufferVerifierBase).m_log,*ppSVar1);
  pSVar5 = *ppSVar1;
  if (pSVar5 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar5);
  }
  operator_delete(pSVar5,0xd0);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
             ,0x1c4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

VertexArrayVerifier::VertexArrayVerifier (glu::RenderContext& renderCtx, tcu::TestLog& log)
	: BufferVerifierBase	(renderCtx, log)
	, m_program				(DE_NULL)
	, m_posLoc				(0)
	, m_byteVecLoc			(0)
	, m_vao					(0)
{
	const glu::ContextType	ctxType		= renderCtx.getType();
	const glu::GLSLVersion	glslVersion	= glu::isContextTypeES(ctxType) ? glu::GLSL_VERSION_300_ES : glu::GLSL_VERSION_330;

	DE_ASSERT(glu::isGLSLVersionSupported(ctxType, glslVersion));

	m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(
		string(glu::getGLSLVersionDeclaration(glslVersion)) + "\n"
		"in highp vec2 a_position;\n"
		"in mediump vec3 a_byteVec;\n"
		"out mediump vec3 v_byteVec;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_byteVec = a_byteVec;\n"
		"}\n",

		string(glu::getGLSLVersionDeclaration(glslVersion)) + "\n"
		"in mediump vec3 v_byteVec;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main (void)\n"
		"{\n"
		"	o_color = vec4(v_byteVec, 1.0);\n"
		"}\n"));

	if (!m_program->isOk())
	{
		m_log << *m_program;
		delete m_program;
		TCU_FAIL("Compile failed");
	}

	const glw::Functions& gl = m_renderCtx.getFunctions();
	m_posLoc		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	m_byteVecLoc	= gl.getAttribLocation(m_program->getProgram(), "a_byteVec");

	gl.genVertexArrays(1, &m_vao);
	gl.genBuffers(1, &m_positionBuf);
	gl.genBuffers(1, &m_indexBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Initialization failed");
}